

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast_t.cpp
# Opt level: O2

int __thiscall deci::ast_exit_t::Generate(ast_exit_t *this,ostream *output,int pc)

{
  ast_item_t *paVar1;
  int iVar2;
  string *psVar3;
  ostream *poVar4;
  runtime_error *this_00;
  
  paVar1 = (this->super_ast_item_t).parent;
  if (paVar1 == (ast_item_t *)0x0) {
    iVar2 = -1;
  }
  else {
    iVar2 = (*paVar1->_vptr_ast_item_t[1])();
  }
  psVar3 = ast_item_t::EndLocationTag_abi_cxx11_(&this->super_ast_item_t);
  if (-1 < iVar2) {
    poVar4 = std::operator<<(output,"jmp __end_");
    poVar4 = std::operator<<(poVar4,(string *)psVar3);
    poVar4 = std::operator<<(poVar4,"_");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar2);
    poVar4 = std::operator<<(poVar4,"__");
    std::endl<char,std::char_traits<char>>(poVar4);
    return pc + 1;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"Exit statement not allowed in non-loop context");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

int ast_exit_t::Generate(std::ostream &output, int pc) const {

    int                end_loc = this->EndLocationPos();
    const std::string& end_tag = this->EndLocationTag();

    if (end_loc < 0) 
    {
      throw std::runtime_error("Exit statement not allowed in non-loop context");
    }

    output << "jmp __end_" << end_tag << "_" << end_loc << "__" << std::endl;
    return pc + 1;
  }